

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::ClearDamageDescriptionRecords(Entity_Damage_Status_PDU *this)

{
  Entity_Damage_Status_PDU *this_local;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&this->m_vDdRec);
  this->m_ui16NumDmgDescRecs = 0;
  (this->super_Header).super_Header6.m_ui16PDULength = 0x18;
  return;
}

Assistant:

void Entity_Damage_Status_PDU::ClearDamageDescriptionRecords()
{
    m_vDdRec.clear();
    m_ui16NumDmgDescRecs = 0;
    m_ui16PDULength = ENTITY_DAMAGE_STATE_PDU;
}